

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O1

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
__thiscall
pstore::maybe<std::__cxx11::string,void>::operator=
          (maybe<std::__cxx11::string,void> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  size_type *local_38;
  size_type local_28;
  undefined8 uStack_20;
  
  paVar1 = &other->field_2;
  if (*this == (maybe<std::__cxx11::string,void>)0x1) {
    local_38 = (size_type *)(other->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38 == paVar1) {
      local_28 = paVar1->_M_allocated_capacity;
      uStack_20 = *(undefined8 *)((long)&other->field_2 + 8);
      local_38 = &local_28;
    }
    else {
      local_28 = paVar1->_M_allocated_capacity;
    }
    (other->_M_dataplus)._M_p = (pointer)paVar1;
    other->_M_string_length = 0;
    (other->field_2)._M_local_buf[0] = '\0';
    pbVar4 = value_impl<pstore::maybe<std::__cxx11::string,void>&,std::__cxx11::string>
                       ((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                         *)this);
    std::__cxx11::string::swap((string *)pbVar4);
    if (local_38 != &local_28) {
      operator_delete(local_38,local_28 + 1);
    }
  }
  else {
    *(maybe<std::__cxx11::string,void> **)(this + 8) = this + 0x18;
    pcVar2 = (other->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&other->field_2 + 8);
      *(size_type *)(this + 0x18) = paVar1->_M_allocated_capacity;
      *(undefined8 *)(this + 0x20) = uVar3;
    }
    else {
      *(pointer *)(this + 8) = pcVar2;
      *(size_type *)(this + 0x18) = paVar1->_M_allocated_capacity;
    }
    *(size_type *)(this + 0x10) = other->_M_string_length;
    (other->_M_dataplus)._M_p = (pointer)paVar1;
    other->_M_string_length = 0;
    (other->field_2)._M_local_buf[0] = '\0';
    *this = (maybe<std::__cxx11::string,void>)0x1;
  }
  return (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *)this;
}

Assistant:

maybe & operator= (U && other) noexcept (
            std::is_nothrow_copy_assignable<T>::value && std::is_nothrow_copy_constructible<
                T>::value && std::is_nothrow_move_assignable<T>::value &&
                std::is_nothrow_move_constructible<T>::value) {

            if (valid_) {
                T temp = std::forward<U> (other);
                std::swap (this->value (), temp);
            } else {
                new (&storage_) T (std::forward<U> (other));
                valid_ = true;
            }
            return *this;
        }